

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::
         ConstructMessageRecursive<unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,unsigned_long param,unsigned_long params,unsigned_long params_1,
                   unsigned_long params_2,unsigned_long params_3)

{
  unsigned_long in_RSI;
  string *in_RDI;
  string *in_R8;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *in_R9;
  value_type *in_stack_ffffffffffffff58;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffff60;
  unsigned_long in_stack_ffffffffffffffb8;
  unsigned_long in_stack_ffffffffffffffc0;
  unsigned_long in_stack_ffffffffffffffc8;
  
  ExceptionFormatValue::CreateFormatValue<unsigned_long>((unsigned_long)in_stack_ffffffffffffff58);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x196f7a0);
  ConstructMessageRecursive<unsigned_long,unsigned_long,unsigned_long,unsigned_long>
            (in_R8,in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,in_RSI);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}